

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_CoinSelectBnB_with_multiple_asset_Test::TestBody
          (CoinSelection_SelectCoins_CoinSelectBnB_with_multiple_asset_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  mapped_type *pmVar3;
  Amount *binary_data;
  ulong uVar4;
  char *pcVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *this_00;
  mapped_type_conflict *pmVar9;
  char *in_R9;
  Amount AVar10;
  CoinSelectionOption *in_stack_00000078;
  UtxoFilter *in_stack_00000080;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_00000088;
  AmountMap *in_stack_00000090;
  CoinSelection *in_stack_00000098;
  Amount *in_stack_000000b0;
  AmountMap *in_stack_000000b8;
  Amount *in_stack_000000c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_000000c8;
  AmountMap *in_stack_000000d0;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  Txid txid;
  TestElementsUtxoCoinVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *__range1;
  iterator ite;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  CoinSelection coin_select;
  reference in_stack_fffffffffffff958;
  CoinSelectionOption *in_stack_fffffffffffff960;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff968;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffff978;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_fffffffffffff9a0;
  string local_550;
  AssertHelper local_530;
  Message local_528;
  string local_520;
  byte local_4f9;
  AssertionResult local_4f8;
  string local_4e8;
  AssertHelper local_4c8;
  Message local_4c0;
  string local_4b8;
  AssertionResult local_498;
  AssertHelper local_488;
  Message local_480;
  undefined4 local_474;
  size_type local_470;
  AssertionResult local_468;
  AssertHelper local_458;
  Message local_450;
  undefined4 local_444;
  int64_t local_440;
  AssertionResult local_438;
  AssertHelper local_428;
  Message local_420;
  undefined4 local_414;
  string local_410;
  AssertionResult local_3f0;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined4 local_3cc;
  string local_3c8;
  AssertionResult local_3a8;
  AssertHelper local_398;
  Message local_390;
  undefined4 local_384;
  size_type local_380;
  AssertionResult local_378;
  AssertHelper local_368;
  Message local_360;
  undefined8 local_358;
  AssertionResult local_350;
  AssertHelper local_340;
  Message local_338;
  undefined8 local_330;
  AssertionResult local_328;
  AssertHelper local_318;
  Message local_310;
  undefined8 local_308;
  AssertionResult local_300;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined8 local_2e0;
  AssertionResult local_2d8;
  AssertHelper local_2c8;
  Message local_2c0;
  undefined4 local_2b4;
  size_type local_2b0;
  AssertionResult local_2a8;
  AssertHelper local_298;
  Message local_290 [5];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_268;
  int64_t local_250;
  undefined1 local_248;
  int64_t local_240;
  undefined1 local_238;
  Txid local_230;
  Txid local_210;
  reference local_1f0;
  TestElementsUtxoCoinVector *local_1e8;
  __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
  local_1e0;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *local_1d8;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_1d0 [4];
  char local_1b0 [104];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_148 [2];
  undefined7 in_stack_fffffffffffffef1;
  Amount *amount;
  uint8_t uVar11;
  undefined7 in_stack_ffffffffffffff01;
  uint32_t in_stack_ffffffffffffff0c;
  pointer in_stack_ffffffffffffff10;
  Utxo *in_stack_ffffffffffffff20;
  Script *in_stack_ffffffffffffff28;
  string local_b8;
  string local_88 [4];
  
  cfd::CoinSelection::CoinSelection
            ((CoinSelection *)in_stack_fffffffffffff960,
             SUB81((ulong)in_stack_fffffffffffff958 >> 0x38,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x2744ae);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_88,&exp_dummy_asset_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)in_stack_fffffffffffff9a0,
                        (key_type *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  *pmVar3 = 0x5f5d8cc;
  std::__cxx11::string::~string((string *)local_88);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_b8,&exp_dummy_asset_b);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)in_stack_fffffffffffff9a0,
                        (key_type *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  *pmVar3 = 0x14a7184a;
  std::__cxx11::string::~string((string *)&local_b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27455d);
  cfd::core::Amount::Amount((Amount *)&stack0xffffffffffffff08);
  AVar10 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  binary_data = (Amount *)AVar10.amount_;
  uVar2 = AVar10.ignore_check_;
  amount = binary_data;
  uVar11 = uVar2;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x2745d0);
  GetElementsOption();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffff960,(double)in_stack_fffffffffffff958);
  cfd::CoinSelectionOption::SetFeeAsset
            (in_stack_fffffffffffff960,(ConfidentialAssetId *)in_stack_fffffffffffff958);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x274621);
  std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::size
            (&kExtCoinSelectElementsTestVector);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978);
  local_1d0[0]._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                         ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff958
                         );
  local_1d8 = &kExtCoinSelectElementsTestVector;
  local_1e0._M_current =
       (TestElementsUtxoCoinVector *)
       std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::begin
                 ((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffff958);
  local_1e8 = (TestElementsUtxoCoinVector *)
              std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::
              end((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffff958);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffff960,
                            (__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffff958), bVar1) {
    local_1f0 = __gnu_cxx::
                __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                ::operator*(&local_1e0);
    cfd::core::Txid::Txid(&local_210);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cfd::core::Txid::Txid(&local_230,&local_1f0->txid);
      cfd::core::Txid::operator=(&local_210,&local_230);
      cfd::core::Txid::~Txid((Txid *)0x27471d);
    }
    AVar10 = cfd::core::Amount::CreateBySatoshiAmount(local_1f0->amount);
    local_250 = AVar10.amount_;
    local_248 = AVar10.ignore_check_;
    local_240 = local_250;
    local_238 = local_248;
    in_stack_fffffffffffff958 =
         __gnu_cxx::
         __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
         operator*(local_1d0);
    in_stack_fffffffffffff960 = (CoinSelectionOption *)0x0;
    in_R9 = (char *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              ((Txid *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               (string *)CONCAT71(in_stack_ffffffffffffff01,uVar11),amount,
               (string *)CONCAT71(in_stack_fffffffffffffef1,uVar2),binary_data,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(local_1d0);
    cfd::core::Txid::~Txid((Txid *)0x274920);
    __gnu_cxx::
    __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
    ::operator++(&local_1e0);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x274951);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffff970 = local_148;
      in_stack_fffffffffffff968 =
           (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&stack0xffffffffffffff08;
      in_stack_fffffffffffff960 = (CoinSelectionOption *)&stack0xffffffffffffff18;
      in_stack_fffffffffffff958 = (reference)&stack0xfffffffffffffef8;
      in_stack_fffffffffffff978 = (char *)0x0;
      in_R9 = local_1b0;
      cfd::CoinSelection::SelectCoins
                (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
                 in_stack_00000078,in_stack_000000b0,in_stack_000000b8,in_stack_000000c0,
                 in_stack_000000c8,in_stack_000000d0);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffff970,in_stack_fffffffffffff968);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff970);
    }
  }
  else {
    testing::Message::Message(local_290);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x4fa,
               "Expected: ret = coin_select.SelectCoins( map_target_amount, utxos, exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_298,local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message((Message *)0x274adf);
  }
  local_2b0 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_268);
  local_2b4 = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (unsigned_long *)in_stack_fffffffffffff968,(int *)in_stack_fffffffffffff960);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x274bd4);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x4fc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    testing::Message::~Message((Message *)0x274c37);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x274c8f);
  sVar6 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_268);
  if (sVar6 == 4) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_268,0);
    local_2e0 = 0x14a61a62;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (unsigned_long *)in_stack_fffffffffffff968,(long *)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
    if (!bVar1) {
      testing::Message::Message(&local_2e8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x274d5e);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4fe,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
      testing::internal::AssertHelper::~AssertHelper(&local_2f0);
      testing::Message::~Message((Message *)0x274dc1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x274e16);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_268,1);
    local_308 = 750000;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (unsigned_long *)in_stack_fffffffffffff968,(long *)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_300);
    if (!bVar1) {
      testing::Message::Message(&local_310);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x274ecf);
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4ff,pcVar5);
      testing::internal::AssertHelper::operator=(&local_318,&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      testing::Message::~Message((Message *)0x274f32);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x274f87);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_268,2);
    local_330 = 0x511f364;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (unsigned_long *)in_stack_fffffffffffff968,(long *)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_328);
    if (!bVar1) {
      testing::Message::Message(&local_338);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x275040);
      testing::internal::AssertHelper::AssertHelper
                (&local_340,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x500,pcVar5);
      testing::internal::AssertHelper::operator=(&local_340,&local_338);
      testing::internal::AssertHelper::~AssertHelper(&local_340);
      testing::Message::~Message((Message *)0x2750a3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2750f8);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_268,3);
    local_358 = 0xe3f1de;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (unsigned_long *)in_stack_fffffffffffff968,(long *)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
    if (!bVar1) {
      testing::Message::Message(&local_360);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2751b1);
      testing::internal::AssertHelper::AssertHelper
                (&local_368,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x501,pcVar5);
      testing::internal::AssertHelper::operator=(&local_368,&local_360);
      testing::internal::AssertHelper::~AssertHelper(&local_368);
      testing::Message::~Message((Message *)0x275214);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x275269);
  }
  local_380 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)0x27528a);
  local_384 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (unsigned_long *)in_stack_fffffffffffff968,(int *)in_stack_fffffffffffff960);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_378);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x275327);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x503,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message((Message *)0x27538a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2753e2);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)0x2753ef);
  if (sVar7 == 2) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_3c8,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)in_stack_fffffffffffff9a0,
                 (key_type *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    local_3cc = 0x5f5e542;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (long *)in_stack_fffffffffffff968,(int *)in_stack_fffffffffffff960);
    std::__cxx11::string::~string((string *)&local_3c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x275508);
      testing::internal::AssertHelper::AssertHelper
                (&local_3e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x505,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_3e0);
      testing::Message::~Message((Message *)0x27556b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2755c3);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_410,&exp_dummy_asset_b);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)in_stack_fffffffffffff9a0,
                 (key_type *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    local_414 = 0x14b18c12;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (long *)in_stack_fffffffffffff968,(int *)in_stack_fffffffffffff960);
    std::__cxx11::string::~string((string *)&local_410);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
    if (!bVar1) {
      testing::Message::Message(&local_420);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2756d2);
      testing::internal::AssertHelper::AssertHelper
                (&local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x506,pcVar5);
      testing::internal::AssertHelper::operator=(&local_428,&local_420);
      testing::internal::AssertHelper::~AssertHelper(&local_428);
      testing::Message::~Message((Message *)0x27572f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x275784);
  }
  local_440 = cfd::core::Amount::GetSatoshiValue((Amount *)&stack0xffffffffffffff08);
  local_444 = 0x2e0;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (long *)in_stack_fffffffffffff968,(int *)in_stack_fffffffffffff960);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_438);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x275848);
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x508,pcVar5);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    testing::Message::~Message((Message *)0x2758a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2758fa);
  local_470 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)0x275907);
  local_474 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (unsigned_long *)in_stack_fffffffffffff968,(int *)in_stack_fffffffffffff960);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_468);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2759b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x509,pcVar5);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message((Message *)0x275a0d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x275a65);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)0x275a72);
  if (sVar8 == 2) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_4b8,&exp_dummy_asset_a);
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 ::operator[](in_stack_fffffffffffff9a0,
                              (key_type *)
                              CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0x275ac4);
    std::__cxx11::string::~string((string *)&local_4b8);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_498);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_4c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4e8,(internal *)&local_498,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","false","true",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x50b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
      testing::internal::AssertHelper::~AssertHelper(&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      testing::Message::~Message((Message *)0x275bef);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x275c6a);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_520,&exp_dummy_asset_b);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](this_00,(key_type *)CONCAT17(uVar2,in_stack_fffffffffffff998));
    local_4f9 = ~*pmVar9 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0x275cc7);
    std::__cxx11::string::~string((string *)&local_520);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f8);
    if (!bVar1) {
      testing::Message::Message(&local_528);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_550,(internal *)&local_4f8,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_b.GetHex()]","true","false",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_530,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x50c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_530,&local_528);
      testing::internal::AssertHelper::~AssertHelper(&local_530);
      std::__cxx11::string::~string((string *)&local_550);
      testing::Message::~Message((Message *)0x275df2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x275e6a);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff970);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff970);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x275ea2);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x275eaf);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x275ebc);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x275ec9);
  cfd::CoinSelection::~CoinSelection((CoinSelection *)0x275ed6);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_CoinSelectBnB_with_multiple_asset)
{
  CoinSelection coin_select(true);
  // Same condition with "SelectCoins_SelectCoinsBnB"
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 99997900;
  map_target_amount[exp_dummy_asset_b.GetHex()] = 346495050;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetEffectiveFeeBaserate(2);
  option.SetFeeAsset(exp_dummy_asset_a);

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset, nullptr,
        &(*ite));
    ++ite;
  }

  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = coin_select.SelectCoins(
      map_target_amount, utxos, exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 4);
  if (ret.size() == 4) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(346430050));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(750000));
    EXPECT_EQ(ret[2].amount, static_cast<int64_t>(85062500));
    EXPECT_EQ(ret[3].amount, static_cast<int64_t>(14938590));
  }
  EXPECT_EQ(map_select_value.size(), 2);
  if (map_select_value.size() == 2) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 100001090);
    EXPECT_EQ(map_select_value[exp_dummy_asset_b.GetHex()], 347180050);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 736);
  EXPECT_EQ(map_searched_bnb.size(), 2);
  if (map_searched_bnb.size() == 2) {
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_b.GetHex()]);
  }
}